

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

void __thiscall
rapidxml::xml_document<char>::parse_node_contents<0>
          (xml_document<char> *this,char **text,xml_node<char> *node)

{
  char cVar1;
  char *tmp;
  char *pcVar2;
  byte *pbVar3;
  byte *pbVar4;
  xml_node<char> *child;
  undefined8 *puVar5;
  char *pcVar6;
  
  do {
    pcVar6 = *text;
    pcVar2 = pcVar6 + -1;
    do {
      pbVar3 = (byte *)(pcVar2 + 1);
      pcVar2 = pcVar2 + 1;
    } while (internal::lookup_tables<0>::lookup_whitespace[*pbVar3] != '\0');
    *text = pcVar2;
    cVar1 = *pcVar2;
    while (cVar1 != '<') {
      if (cVar1 == '\0') {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
        pcVar2 = *text;
        *puVar5 = &PTR__exception_001dfc78;
        pcVar6 = "unexpected end of data";
        goto LAB_001a20e3;
      }
      cVar1 = parse_and_append_data<0>(this,node,text,pcVar6);
    }
    pcVar2 = *text;
    pbVar3 = (byte *)(pcVar2 + 1);
    cVar1 = pcVar2[1];
    if (cVar1 == '/') {
      *text = pcVar2 + 2;
      do {
        pbVar4 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      } while (internal::lookup_tables<0>::lookup_node_name[*pbVar4] != '\0');
      *text = (char *)pbVar3;
      do {
        pbVar4 = pbVar3;
        pbVar3 = pbVar4 + 1;
      } while (internal::lookup_tables<0>::lookup_whitespace[*pbVar4] != '\0');
      *text = (char *)pbVar4;
      if (*pbVar4 != 0x3e) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
        pcVar2 = *text;
        *puVar5 = &PTR__exception_001dfc78;
        pcVar6 = "expected >";
LAB_001a20e3:
        puVar5[1] = pcVar6;
        puVar5[2] = pcVar2;
        __cxa_throw(puVar5,&parse_error::typeinfo,std::exception::~exception);
      }
      *text = (char *)(pbVar4 + 1);
    }
    else {
      *text = (char *)pbVar3;
      child = parse_node<0>(this,text);
      if (child != (xml_node<char> *)0x0) {
        xml_node<char>::append_node(node,child);
      }
    }
    if (cVar1 == '/') {
      return;
    }
  } while( true );
}

Assistant:

void parse_node_contents(Ch *&text, xml_node<Ch> *node)
        {
            // For all children and text
            while (1)
            {
                // Skip whitespace between > and node contents
                Ch *contents_start = text;      // Store start of node contents before whitespace is skipped
                skip<whitespace_pred, Flags>(text);
                Ch next_char = *text;

            // After data nodes, instead of continuing the loop, control jumps here.
            // This is because zero termination inside parse_and_append_data() function
            // would wreak havoc with the above code.
            // Also, skipping whitespace after data nodes is unnecessary.
            after_data_node:    
                
                // Determine what comes next: node closing, child node, data node, or 0?
                switch (next_char)
                {
                
                // Node closing or child node
                case Ch('<'):
                    if (text[1] == Ch('/'))
                    {
                        // Node closing
                        text += 2;      // Skip '</'
                        if (Flags & parse_validate_closing_tags)
                        {
                            // Skip and validate closing tag name
                            Ch *closing_name = text;
                            skip<node_name_pred, Flags>(text);
                            if (!internal::compare(node->name(), node->name_size(), closing_name, text - closing_name, true))
                                RAPIDXML_PARSE_ERROR("invalid closing tag name", text);
                        }
                        else
                        {
                            // No validation, just skip name
                            skip<node_name_pred, Flags>(text);
                        }
                        // Skip remaining whitespace after node name
                        skip<whitespace_pred, Flags>(text);
                        if (*text != Ch('>'))
                            RAPIDXML_PARSE_ERROR("expected >", text);
                        ++text;     // Skip '>'
                        return;     // Node closed, finished parsing contents
                    }
                    else
                    {
                        // Child node
                        ++text;     // Skip '<'
                        if (xml_node<Ch> *child = parse_node<Flags>(text))
                            node->append_node(child);
                    }
                    break;

                // End of data - error
                case Ch('\0'):
                    RAPIDXML_PARSE_ERROR("unexpected end of data", text);

                // Data node
                default:
                    next_char = parse_and_append_data<Flags>(node, text, contents_start);
                    goto after_data_node;   // Bypass regular processing after data nodes

                }
            }
        }